

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,vector3h *value)

{
  bool bVar1;
  half hVar2;
  float3 v;
  array<float,_3UL> local_1c;
  
  bVar1 = ParseBasicTypeTuple<float,3ul>(this,&local_1c);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_1c._M_elems[0]);
    (value->x).value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_1c._M_elems[1]);
    (value->y).value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_1c._M_elems[2]);
    (value->z).value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::vector3h *value) {
  value::float3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->x = value::float_to_half_full(v[0]);
    value->y = value::float_to_half_full(v[1]);
    value->z = value::float_to_half_full(v[2]);
    return true;
  }
  return false;
}